

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int i;
  int dim;
  Matrix33<float> A3;
  Matrix33<float> A2;
  Matrix33<float> A1;
  T threshold;
  Matrix33<float> V;
  Matrix33<float> U;
  TV S;
  TV maxV;
  TV minV;
  int local_ec;
  Matrix33 local_e4 [4];
  Matrix33<float> *in_stack_ffffffffffffff20;
  Matrix33<float> local_c0;
  Matrix33<float> local_9c;
  BaseType_conflict2 local_78;
  Matrix33<float> local_74;
  Matrix33<float> local_50;
  Vec3<float> local_2c;
  Vec3<float> local_20;
  Vec3<float> local_14;
  Matrix33<float> *local_8;
  
  local_8 = in_RDI;
  Imath_3_2::Vec3<float>::Vec3(&local_14);
  Imath_3_2::Vec3<float>::Vec3(&local_20);
  Imath_3_2::Vec3<float>::Vec3(&local_2c);
  Imath_3_2::Matrix33<float>::Matrix33(&local_50);
  Imath_3_2::Matrix33<float>::Matrix33(&local_74);
  local_78 = computeThreshold<Imath_3_2::Matrix33<float>>(in_stack_ffffffffffffff20);
  Imath_3_2::Matrix33<float>::Matrix33(&local_9c,local_8);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
            ((Matrix33 *)&local_9c,(Vec3 *)&local_14);
  Imath_3_2::Matrix33<float>::Matrix33(&local_c0,local_8);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
            ((Matrix33 *)&local_c0,(Vec3 *)&local_20);
  Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)local_e4,local_8);
  fVar2 = std::numeric_limits<float>::epsilon();
  Imath_3_2::jacobiSVD<float>
            (local_e4,(Matrix33 *)&local_50,(Vec3 *)&local_2c,(Matrix33 *)&local_74,fVar2,false);
  local_ec = 0;
  while( true ) {
    if (2 < local_ec) {
      return;
    }
    Imath_3_2::Vec3<float>::operator[](&local_14,local_ec);
    pMVar1 = &local_74;
    Imath_3_2::Matrix33<float>::operator[](pMVar1,local_ec);
    std::abs((int)pMVar1);
    if (local_78 <= extraout_XMM0_Da) break;
    Imath_3_2::Vec3<float>::operator[](&local_20,local_ec);
    pMVar1 = &local_74;
    Imath_3_2::Matrix33<float>::operator[](pMVar1,local_ec);
    std::abs((int)pMVar1);
    if (local_78 <= extraout_XMM0_Da_00) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]")
      ;
    }
    local_ec = local_ec + 1;
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}